

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O2

char * M680X_insn_name(csh handle,uint id)

{
  char (*pacVar1) [6];
  
  pacVar1 = (char (*) [6])0x0;
  if (id < 0x165) {
    pacVar1 = s_instruction_names + id;
  }
  return *pacVar1;
}

Assistant:

const char *M680X_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET

	if (id >= ARR_SIZE(s_instruction_names))
		return NULL;
	else
		return s_instruction_names[(int)id];

#else
	return NULL;
#endif
}